

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O3

void start_element_handler(void *data,char *el,char **attr)

{
  coda_format format;
  hashtable *table;
  uint uVar1;
  int iVar2;
  coda_dynamic_type *in_RAX;
  long lVar3;
  char *pcVar4;
  coda_mem_array *pcVar5;
  coda_type_array *pcVar6;
  coda_mem_record *pcVar7;
  coda_type_record *pcVar8;
  coda_dynamic_type *pcVar9;
  coda_xml_product *product;
  char *pcVar10;
  coda_type_array *definition;
  ulong index;
  long lVar11;
  coda_mem_record *parent;
  coda_dynamic_type *local_38;
  
  iVar2 = *(int *)((long)data + 0x18);
  lVar3 = (long)iVar2;
  pcVar9 = *(coda_dynamic_type **)((long)data + lVar3 * 8 + 0x120);
  local_38 = in_RAX;
  if (pcVar9 == (coda_dynamic_type *)0x0) {
    pcVar4 = *(char **)((long)data + lVar3 * 8 + 800);
    pcVar10 = "mixed content for element \'%s\' is not supported";
LAB_00166412:
    coda_set_error(-300,pcVar10,pcVar4);
    goto LAB_00166441;
  }
  format = pcVar9->definition->format;
  if (format != coda_format_xml) {
    el = *(char **)((long)data + lVar3 * 8 + 800);
    pcVar4 = coda_type_get_format_name(format);
    pcVar10 = "xml element \'%s\' not allowed inside %s data";
LAB_0016643a:
    coda_set_error(-300,pcVar10,el,pcVar4);
    goto LAB_00166441;
  }
  *(undefined8 *)((long)data + 0x430) = 0;
  if (0x1e < iVar2) {
    coda_set_error(-300,"xml file exceeds maximum supported hierarchical depth (%d)",0x20);
    goto LAB_00166441;
  }
  *(int *)((long)data + 0x18) = iVar2 + 1;
  *(undefined8 *)((long)data + lVar3 * 8 + 0x128) = 0;
  local_38 = pcVar9;
  lVar3 = coda_hashtable_get_index_from_name(*(hashtable **)&pcVar9->definition[1].type_class,el);
  uVar1 = (uint)lVar3;
  if ((int)uVar1 < 0) {
    table = *(hashtable **)&pcVar9->definition[1].type_class;
    pcVar4 = coda_element_name_from_xml_name(el);
    lVar3 = coda_hashtable_get_index_from_name(table,pcVar4);
    uVar1 = (uint)lVar3;
    if ((int)uVar1 < 0) {
      if (*(int *)((long)data + 0x428) == 0) {
        if ((long)*(int *)((long)data + 0x18) == 1) {
          pcVar10 = "xml element \'%s\' is not allowed as root element";
          pcVar4 = el;
          goto LAB_00166412;
        }
        pcVar4 = *(char **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x318);
        pcVar10 = "xml element \'%s\' is not allowed within element \'%s\'";
        goto LAB_0016643a;
      }
      pcVar8 = coda_type_record_new(coda_format_xml);
      if (pcVar8 == (coda_type_record *)0x0) goto LAB_00166441;
      iVar2 = coda_type_record_create_field
                        ((coda_type_record *)pcVar9->definition,el,(coda_type *)pcVar8);
      coda_type_release((coda_type *)pcVar8);
      if ((iVar2 != 0) || (iVar2 = coda_mem_type_update(&local_38,pcVar9->definition), iVar2 != 0))
      goto LAB_00166441;
      if (local_38 !=
          *(coda_dynamic_type **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x118)) {
        __assert_fail("parent == info->record[info->depth - 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x18b,"void start_element_handler(void *, const char *, const char **)");
      }
      lVar3 = coda_hashtable_get_index_from_name
                        (*(hashtable **)&local_38->definition[1].type_class,el);
      uVar1 = (uint)lVar3;
      pcVar9 = local_38;
      if ((int)uVar1 < 0) {
        __assert_fail("index >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x18d,"void start_element_handler(void *, const char *, const char **)");
      }
    }
  }
  index = (ulong)uVar1;
  iVar2 = *(int *)((long)data + 0x18);
  *(ulong *)((long)data + (long)iVar2 * 8 + 0x220) = index;
  *(long *)((long)data + (long)iVar2 * 8 + 0x20) =
       *(long *)(pcVar9->definition[1].description + index * 8) + 0x10;
  iVar2 = coda_type_get_record_field_real_name
                    (pcVar9->definition,index,(char **)((long)data + (long)iVar2 * 8 + 800));
  if (iVar2 != 0) goto LAB_00166441;
  lVar3 = (long)*(int *)((long)data + 0x18);
  definition = (coda_type_array *)**(undefined8 **)((long)data + lVar3 * 8 + 0x20);
  if (definition->type_class == coda_array_class) {
    if (definition->format == coda_format_xml) {
      pcVar6 = definition;
      if (*(long *)(&(local_38[2].definition)->format + index * 2) == 0) {
        pcVar5 = coda_mem_array_new(definition,(coda_dynamic_type *)0x0);
        *(coda_mem_array **)(&(local_38[2].definition)->format + index * 2) = pcVar5;
        if (*(long *)(&(local_38[2].definition)->format + index * 2) == 0) goto LAB_00166441;
        goto LAB_00166550;
      }
LAB_00166554:
      *(coda_type ***)((long)data + lVar3 * 8 + 0x20) = &pcVar6->base_type;
      definition = (coda_type_array *)pcVar6->base_type;
    }
  }
  else if (*(long *)(&(local_38[2].definition)->format + index * 2) != 0) {
    if (*(int *)((long)data + 0x428) == 0) {
      pcVar4 = *(char **)((long)data + lVar3 * 8 + 0x318);
      pcVar10 = "xml element \'%s\' is not allowed more than once within element \'%s\'";
      goto LAB_0016643a;
    }
    pcVar6 = coda_type_array_new(coda_format_xml);
    if (pcVar6 == (coda_type_array *)0x0) goto LAB_00166441;
    iVar2 = coda_type_array_set_base_type(pcVar6,(coda_type *)definition);
    if (iVar2 != 0) {
      coda_type_release((coda_type *)pcVar6);
      goto LAB_00166441;
    }
    **(undefined8 **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20) = pcVar6;
    coda_type_release((coda_type *)definition);
    iVar2 = coda_type_array_add_variable_dimension(pcVar6,(coda_expression *)0x0);
    if (((iVar2 != 0) ||
        (pcVar5 = coda_mem_array_new(pcVar6,(coda_dynamic_type *)0x0),
        pcVar5 == (coda_mem_array *)0x0)) ||
       (iVar2 = coda_mem_array_add_element
                          (pcVar5,*(coda_dynamic_type **)
                                   (&(local_38[2].definition)->format + index * 2)), iVar2 != 0))
    goto LAB_00166441;
    *(coda_mem_array **)(&(local_38[2].definition)->format + index * 2) = pcVar5;
LAB_00166550:
    lVar3 = (long)*(int *)((long)data + 0x18);
    goto LAB_00166554;
  }
  pcVar8 = definition->attributes;
  if (pcVar8 == (coda_type_record *)0x0) {
    *(undefined8 *)((long)data + 0x420) = 0;
    pcVar4 = *attr;
    if (*(int *)((long)data + 0x428) == 0) {
      if (pcVar4 != (char *)0x0) {
        pcVar10 = "xml attribute \'%s\' is not allowed";
        goto LAB_00166412;
      }
    }
    else if ((pcVar4 != (char *)0x0) || (pcVar4 = coda_element_name_from_xml_name(el), pcVar4 != el)
            ) {
      pcVar8 = coda_type_record_new(coda_format_xml);
      definition->attributes = pcVar8;
      if (pcVar8 == (coda_type_record *)0x0) goto LAB_00166441;
      product = *(coda_xml_product **)((long)data + 0x10);
      iVar2 = *(int *)((long)data + 0x428);
      goto LAB_00166664;
    }
  }
  else {
    product = *(coda_xml_product **)((long)data + 0x10);
    iVar2 = *(int *)((long)data + 0x428);
LAB_00166664:
    pcVar7 = attribute_record_new(pcVar8,product,el,attr,iVar2);
    *(coda_mem_record **)((long)data + 0x420) = pcVar7;
    if (pcVar7 == (coda_mem_record *)0x0) goto LAB_00166441;
  }
  if (definition->format != coda_format_xml) {
    return;
  }
  if (definition->type_class != coda_record_class) {
    return;
  }
  if ((int)definition->dim[2] != 0) {
    __assert_fail("!((coda_type_record *)definition)->is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x223,"void start_element_handler(void *, const char *, const char **)");
  }
  pcVar7 = coda_mem_record_new((coda_type_record *)definition,
                               *(coda_dynamic_type **)((long)data + 0x420));
  lVar3 = (long)*(int *)((long)data + 0x18);
  *(coda_mem_record **)((long)data + lVar3 * 8 + 0x120) = pcVar7;
  if (pcVar7 != (coda_mem_record *)0x0) {
    if (0 < pcVar7->num_fields) {
      lVar11 = 0;
      do {
        pcVar6 = *(coda_type_array **)(*(long *)(definition->dim[0] + lVar11 * 8) + 0x10);
        if ((pcVar6->type_class == coda_array_class) && (pcVar6->format == coda_format_xml)) {
          pcVar5 = coda_mem_array_new(pcVar6,(coda_dynamic_type *)0x0);
          lVar3 = (long)*(int *)((long)data + 0x18);
          *(coda_mem_array **)
           (*(long *)(*(long *)((long)data + lVar3 * 8 + 0x120) + 0x28) + lVar11 * 8) = pcVar5;
          if (*(long *)(*(long *)(*(long *)((long)data + lVar3 * 8 + 0x120) + 0x28) + lVar11 * 8) ==
              0) goto LAB_00166441;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(long *)(*(long *)((long)data + (long)(int)lVar3 * 8 + 0x120) + 0x20));
    }
    *(undefined8 *)((long)data + 0x420) = 0;
    return;
  }
LAB_00166441:
  coda_XML_StopParser(*data,'\0');
  *(undefined4 *)((long)data + 8) = 1;
  return;
}

Assistant:

static void XMLCALL start_element_handler(void *data, const char *el, const char **attr)
{
    parser_info *info;
    coda_type *definition;
    coda_mem_record *parent;
    int index;

    info = (parser_info *)data;

    if (info->record[info->depth] != NULL)
    {
        if (info->record[info->depth]->definition->format != coda_format_xml)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' not allowed inside %s data",
                           info->xml_name[info->depth],
                           coda_type_get_format_name(info->record[info->depth]->definition->format));
            abort_parser(info);
            return;
        }
    }
    else
    {
        coda_set_error(CODA_ERROR_PRODUCT, "mixed content for element '%s' is not supported",
                       info->xml_name[info->depth]);
        abort_parser(info);
        return;
    }

    info->value_length = 0;

    if (info->depth >= CODA_CURSOR_MAXDEPTH - 1)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "xml file exceeds maximum supported hierarchical depth (%d)",
                       CODA_CURSOR_MAXDEPTH);
        abort_parser(info);
        return;
    }
    info->depth++;

    info->record[info->depth] = NULL;
    parent = info->record[info->depth - 1];
    index = hashtable_get_index_from_name(parent->definition->real_name_hash_data, el);
    if (index < 0)
    {
        index = hashtable_get_index_from_name(parent->definition->real_name_hash_data,
                                              coda_element_name_from_xml_name(el));
    }
    if (index < 0)
    {
        if (info->update_definition)
        {
            /* all xml elements start out as empty records */
            definition = (coda_type *)coda_type_record_new(coda_format_xml);
            if (definition == NULL)
            {
                abort_parser(info);
                return;
            }
            if (coda_type_record_create_field(parent->definition, el, definition) != 0)
            {
                coda_type_release(definition);
                abort_parser(info);
                return;
            }
            coda_type_release(definition);

            if (coda_mem_type_update((coda_dynamic_type **)&parent, (coda_type *)parent->definition) != 0)
            {
                abort_parser(info);
                return;
            }
            /* updating the parent should only have changed the fields, and not the main record */
            assert(parent == info->record[info->depth - 1]);
            index = hashtable_get_index_from_name(parent->definition->real_name_hash_data, el);
            assert(index >= 0);
        }
        else
        {
            if (info->depth == 1)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' is not allowed as root element", el);
            }
            else
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' is not allowed within element '%s'", el,
                               info->xml_name[info->depth - 1]);
            }
            abort_parser(info);
            return;
        }
    }
    info->index[info->depth] = index;
    info->definition[info->depth] = &parent->definition->field[index]->type;
    if (coda_type_get_record_field_real_name((coda_type *)parent->definition, index, &info->xml_name[info->depth]) != 0)
    {
        abort_parser(info);
        return;
    }
    definition = *info->definition[info->depth];

    if (definition->type_class == coda_array_class)
    {
        /* use the base type when the definition points to an array of xml elements */
        if (definition->format == coda_format_xml)
        {
            if (parent->field_type[index] == NULL)
            {
                parent->field_type[index] = (coda_dynamic_type *)coda_mem_array_new((coda_type_array *)definition,
                                                                                    NULL);
                if (parent->field_type[index] == NULL)
                {
                    abort_parser(info);
                    return;
                }
            }
            /* take the array element definition */
            info->definition[info->depth] = &((coda_type_array *)definition)->base_type;
            definition = *info->definition[info->depth];
        }
    }
    else if (parent->field_type[index] != NULL)
    {
        if (info->update_definition)
        {
            coda_mem_array *array;
            coda_type_array *array_definition;

            /* change scalar to array in definition */
            array_definition = coda_type_array_new(coda_format_xml);
            if (array_definition == NULL)
            {
                abort_parser(info);
                return;
            }
            if (coda_type_array_set_base_type(array_definition, definition) != 0)
            {
                coda_type_release((coda_type *)array_definition);
                abort_parser(info);
                return;
            }
            *info->definition[info->depth] = (coda_type *)array_definition;
            coda_type_release(definition);
            if (coda_type_array_add_variable_dimension(array_definition, NULL) != 0)
            {
                abort_parser(info);
                return;
            }

            /* create the array and add the existing element */
            array = coda_mem_array_new(array_definition, NULL);
            if (array == NULL)
            {
                abort_parser(info);
                return;
            }
            if (coda_mem_array_add_element(array, parent->field_type[index]) != 0)
            {
                abort_parser(info);
                return;
            }
            parent->field_type[index] = (coda_dynamic_type *)array;

            /* take the array element definition */
            info->definition[info->depth] = &array_definition->base_type;
            definition = *info->definition[info->depth];
        }
        else
        {
            coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' is not allowed more than once within element '%s'",
                           el, info->xml_name[info->depth - 1]);
            abort_parser(info);
            return;
        }
    }

    /* create attributes record */
    if (definition->attributes == NULL)
    {
        info->attributes = NULL;
        if (info->update_definition)
        {
            if (attr[0] != NULL || el != coda_element_name_from_xml_name(el))
            {
                definition->attributes = coda_type_record_new(coda_format_xml);
                if (definition->attributes == NULL)
                {
                    abort_parser(info);
                    return;
                }
                info->attributes = (coda_dynamic_type *)attribute_record_new(definition->attributes, info->product,
                                                                             el, attr, info->update_definition);
                if (info->attributes == NULL)
                {
                    abort_parser(info);
                    return;
                }
            }
        }
        else
        {
            if (attr[0] != NULL)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml attribute '%s' is not allowed", attr[0]);
                abort_parser(info);
                return;
            }
        }
    }
    else
    {
        info->attributes = (coda_dynamic_type *)attribute_record_new(definition->attributes, info->product, el, attr,
                                                                     info->update_definition);
        if (info->attributes == NULL)
        {
            abort_parser(info);
            return;
        }
    }

    /* xml records are already created here in order to allow adding child xml elements */
    if (definition->format == coda_format_xml && definition->type_class == coda_record_class)
    {
        int i;

        assert(!((coda_type_record *)definition)->is_union);
        info->record[info->depth] = coda_mem_record_new((coda_type_record *)definition, info->attributes);
        if (info->record[info->depth] == NULL)
        {
            abort_parser(info);
            return;
        }
        /* create empty arrays for array child elements */
        for (i = 0; i < info->record[info->depth]->num_fields; i++)
        {
            if (((coda_type_record *)definition)->field[i]->type->type_class == coda_array_class &&
                ((coda_type_record *)definition)->field[i]->type->format == coda_format_xml)
            {
                coda_type *array_definition = ((coda_type_record *)definition)->field[i]->type;

                info->record[info->depth]->field_type[i] =
                    (coda_dynamic_type *)coda_mem_array_new((coda_type_array *)array_definition, NULL);
                if (info->record[info->depth]->field_type[i] == NULL)
                {
                    abort_parser(info);
                    return;
                }
            }
        }
        info->attributes = NULL;
    }
}